

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_game.cpp
# Opt level: O1

bool __thiscall FCajunMaster::LoadBots(FCajunMaster *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  botinfo_t *pbVar6;
  char *pcVar7;
  char **front;
  long lVar8;
  ulong uVar9;
  FString tmp;
  char teamstr [16];
  FScanner sc;
  ulong local_160;
  uint local_154;
  FString local_150;
  FString local_148 [3];
  FScanner local_130;
  
  FScanner::FScanner(&local_130);
  local_150.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  ForgetBots(&bglobal);
  M_GetCajunPath((char *)local_148);
  FString::operator=(&local_150,local_148);
  FString::~FString(local_148);
  if (((FNullStringData *)(local_150.Chars + -0xc))->Len == 0) {
    bVar3 = false;
    DPrintf(1,"No bots.cfg, so no bots\n");
  }
  else {
    FScanner::OpenFile(&local_130,local_150.Chars);
    bVar3 = false;
    local_154 = 0;
    while (bVar1 = FScanner::GetString(&local_130), bVar1) {
      bVar1 = FScanner::Compare(&local_130,"{");
      if (!bVar1) {
        FScanner::ScriptError(&local_130,"Unexpected token \'%s\'\n",local_130.String);
      }
      pbVar6 = (botinfo_t *)operator_new(0x30);
      (pbVar6->skill).reaction = 0;
      (pbVar6->skill).isp = 0;
      pbVar6->inuse = 0;
      pbVar6->lastteam = 0;
      pbVar6->info = (char *)0x0;
      (pbVar6->skill).aiming = 0;
      (pbVar6->skill).perfection = 0;
      pbVar6->next = (botinfo_t *)0x0;
      pbVar6->name = (char *)0x0;
      pcVar7 = copystring("\\autoaim\\0\\movebob\\.25");
      front = &pbVar6->info;
      pbVar6->info = pcVar7;
      bVar1 = false;
      while( true ) {
        FScanner::MustGetString(&local_130);
        bVar2 = FScanner::Compare(&local_130,"}");
        if (bVar2) break;
        iVar4 = FScanner::MatchString(&local_130,BotConfigStrings,8);
        pcVar7 = local_130.String;
        switch(iVar4) {
        case 0:
          FScanner::MustGetString(&local_130);
          appendinfo(front,"name");
          appendinfo(front,local_130.String);
          pcVar7 = copystring(local_130.String);
          pbVar6->name = pcVar7;
          break;
        case 1:
          FScanner::MustGetNumber(&local_130);
          (pbVar6->skill).aiming = local_130.Number;
          break;
        case 2:
          FScanner::MustGetNumber(&local_130);
          (pbVar6->skill).perfection = local_130.Number;
          break;
        case 3:
          FScanner::MustGetNumber(&local_130);
          (pbVar6->skill).reaction = local_130.Number;
          break;
        case 4:
          FScanner::MustGetNumber(&local_130);
          (pbVar6->skill).isp = local_130.Number;
          break;
        case 5:
          FScanner::MustGetString(&local_130);
          bVar3 = IsNum(local_130.String);
          if (bVar3) {
            uVar5 = atoi(local_130.String);
            bVar3 = FTeam::IsValidTeam(&TeamLibrary,uVar5 & 0xff);
            if (!bVar3) {
              uVar5 = 0xff;
            }
            local_160 = (ulong)uVar5;
          }
          else {
            local_160 = 0xff;
            if (Teams.Count != 0) {
              lVar8 = 0;
              uVar9 = 0;
              do {
                pcVar7 = FTeam::GetName((FTeam *)((long)&(Teams.Array)->m_iPlayerCount + lVar8));
                iVar4 = strcasecmp(pcVar7,local_130.String);
                if (iVar4 == 0) {
                  local_160 = uVar9 & 0xffffffff;
                  break;
                }
                uVar9 = uVar9 + 1;
                lVar8 = lVar8 + 0x38;
              } while (uVar9 < Teams.Count);
            }
          }
          appendinfo(front,"team");
          mysnprintf((char *)local_148,0x10,"%d",local_160 & 0xff);
          appendinfo(front,(char *)local_148);
          bVar3 = true;
          break;
        default:
          iVar4 = strcasecmp(local_130.String,"playerclass");
          if (iVar4 == 0) {
            bVar1 = true;
          }
          appendinfo(front,pcVar7);
          FScanner::MustGetString(&local_130);
          appendinfo(front,local_130.String);
        }
      }
      if (!bVar1) {
        appendinfo(front,"playerclass");
        appendinfo(front,"random");
      }
      if (!bVar3) {
        appendinfo(front,"team");
        appendinfo(front,"255");
      }
      pbVar6->next = bglobal.botinfo;
      pbVar6->lastteam = 0xff;
      local_154 = local_154 + 1;
      bglobal.botinfo = pbVar6;
    }
    bVar3 = true;
    Printf("%d bots read from %s\n",(ulong)local_154,"bots.cfg");
  }
  FString::~FString(&local_150);
  FScanner::~FScanner(&local_130);
  return bVar3;
}

Assistant:

bool FCajunMaster::LoadBots ()
{
	FScanner sc;
	FString tmp;
	bool gotteam = false;
	int loaded_bots = 0;

	bglobal.ForgetBots ();
	tmp = M_GetCajunPath(BOTFILENAME);
	if (tmp.IsEmpty())
	{
		DPrintf (DMSG_ERROR, "No " BOTFILENAME ", so no bots\n");
		return false;
	}
	try
	{
		sc.OpenFile(tmp);
	}
	catch (CRecoverableError &err)
	{
		Printf("%s. So no bots\n", err.GetMessage());
		return false;
	}

	while (sc.GetString ())
	{
		if (!sc.Compare ("{"))
		{
			sc.ScriptError ("Unexpected token '%s'\n", sc.String);
		}

		botinfo_t *newinfo = new botinfo_t;
		bool gotclass = false;

		memset (newinfo, 0, sizeof(*newinfo));

		newinfo->info = copystring ("\\autoaim\\0\\movebob\\.25");

		for (;;)
		{
			sc.MustGetString ();
			if (sc.Compare ("}"))
				break;

			switch (sc.MatchString (BotConfigStrings))
			{
			case BOTCFG_NAME:
				sc.MustGetString ();
				appendinfo (newinfo->info, "name");
				appendinfo (newinfo->info, sc.String);
				newinfo->name = copystring (sc.String);
				break;

			case BOTCFG_AIMING:
				sc.MustGetNumber ();
				newinfo->skill.aiming = sc.Number;
				break;

			case BOTCFG_PERFECTION:
				sc.MustGetNumber ();
				newinfo->skill.perfection = sc.Number;
				break;

			case BOTCFG_REACTION:
				sc.MustGetNumber ();
				newinfo->skill.reaction = sc.Number;
				break;

			case BOTCFG_ISP:
				sc.MustGetNumber ();
				newinfo->skill.isp = sc.Number;
				break;

			case BOTCFG_TEAM:
				{
					char teamstr[16];
					BYTE teamnum;

					sc.MustGetString ();
					if (IsNum (sc.String))
					{
						teamnum = atoi (sc.String);
						if (!TeamLibrary.IsValidTeam (teamnum))
						{
							teamnum = TEAM_NONE;
						}
					}
					else
					{
						teamnum = TEAM_NONE;
						for (unsigned int i = 0; i < Teams.Size(); ++i)
						{
							if (stricmp (Teams[i].GetName (), sc.String) == 0)
							{
								teamnum = i;
								break;
							}
						}
					}
					appendinfo (newinfo->info, "team");
					mysnprintf (teamstr, countof(teamstr), "%d", teamnum);
					appendinfo (newinfo->info, teamstr);
					gotteam = true;
					break;
				}

			default:
				if (stricmp (sc.String, "playerclass") == 0)
				{
					gotclass = true;
				}
				appendinfo (newinfo->info, sc.String);
				sc.MustGetString ();
				appendinfo (newinfo->info, sc.String);
				break;
			}
		}
		if (!gotclass)
		{ // Bots that don't specify a class get a random one
			appendinfo (newinfo->info, "playerclass");
			appendinfo (newinfo->info, "random");
		}
		if (!gotteam)
		{ // Same for bot teams
			appendinfo (newinfo->info, "team");
			appendinfo (newinfo->info, "255");
		}
		newinfo->next = bglobal.botinfo;
		newinfo->lastteam = TEAM_NONE;
		bglobal.botinfo = newinfo;
		loaded_bots++;
	}
	Printf ("%d bots read from %s\n", loaded_bots, BOTFILENAME);
	return true;
}